

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O0

cmArgumentParser<cmCoreTryCompile::Arguments> *
anon_unknown.dwarf_14e7ef0::makeTryCompileParser
          (cmArgumentParser<cmCoreTryCompile::Arguments> *__return_storage_ptr__,
          cmArgumentParser<cmCoreTryCompile::Arguments> *base)

{
  cmArgumentParser<cmCoreTryCompile::Arguments> *pcVar1;
  static_string_view name;
  cmArgumentParser<cmCoreTryCompile::Arguments> local_88;
  cmArgumentParser<cmCoreTryCompile::Arguments> *local_18;
  cmArgumentParser<cmCoreTryCompile::Arguments> *base_local;
  
  local_18 = base;
  base_local = __return_storage_ptr__;
  cmArgumentParser<cmCoreTryCompile::Arguments>::cmArgumentParser(&local_88,base);
  name = ::cm::operator____s("OUTPUT_VARIABLE",0xf);
  pcVar1 = cmArgumentParser<cmCoreTryCompile::Arguments>::Bind<std::optional<std::__cxx11::string>>
                     (&local_88,name,0x260);
  cmArgumentParser<cmCoreTryCompile::Arguments>::cmArgumentParser(__return_storage_ptr__,pcVar1);
  cmArgumentParser<cmCoreTryCompile::Arguments>::~cmArgumentParser(&local_88);
  return __return_storage_ptr__;
}

Assistant:

cmArgumentParser<Arguments> makeTryCompileParser(
  const cmArgumentParser<Arguments>& base)
{
  return cmArgumentParser<Arguments>{ base }.Bind("OUTPUT_VARIABLE"_s,
                                                  &Arguments::OutputVariable);
}